

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

saidx64_t sa_simplesearch64(sauchar_t *T,saidx64_t Tsize,saidx64_t *SA,saidx64_t SAsize,saint_t c,
                           saidx64_t *idx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (idx != (saidx64_t *)0x0) {
    *idx = -1;
  }
  if ((SAsize | Tsize) < 0 || (SA == (saidx64_t *)0x0 || T == (sauchar_t *)0x0)) {
    return -1;
  }
  if (SAsize == 0 || Tsize == 0) {
    return 0;
  }
  uVar5 = (ulong)SAsize >> 1;
  lVar7 = 0;
  lVar1 = 0;
  do {
    if (SAsize < 1) {
      lVar2 = 0;
LAB_0010557d:
      if (idx != (saidx64_t *)0x0) {
        if (lVar7 < lVar2) {
          lVar1 = lVar7;
        }
        *idx = lVar1;
      }
      return lVar2 - lVar7;
    }
    lVar2 = lVar1 + uVar5;
    if ((SA[lVar2] < Tsize) && (c <= (int)(uint)T[SA[lVar2]])) {
      if ((uint)T[SA[lVar2]] == c) {
        lVar3 = SAsize + ~uVar5;
        lVar7 = lVar1;
        while (uVar6 = uVar5, 0 < (long)uVar6) {
          uVar5 = (long)uVar6 >> 1;
          if ((Tsize <= SA[lVar7 + uVar5]) || ((int)(uint)T[SA[lVar7 + uVar5]] < c)) {
            lVar7 = lVar7 + uVar5 + 1;
            uVar5 = uVar5 - (~(uint)uVar6 & 1);
          }
        }
        do {
          lVar2 = lVar2 + 1;
          do {
            lVar4 = lVar3;
            if (lVar4 < 1) goto LAB_0010557d;
            lVar3 = lVar4 >> 1;
          } while ((SA[lVar2 + lVar3] < Tsize) && (c < (int)(uint)T[SA[lVar2 + lVar3]]));
          lVar2 = lVar2 + lVar3;
          lVar3 = lVar3 - (ulong)(~(uint)lVar4 & 1);
        } while( true );
      }
    }
    else {
      lVar1 = lVar2 + 1;
      uVar5 = uVar5 - (~(uint)SAsize & 1);
    }
    SAsize = uVar5;
    uVar5 = SAsize >> 1;
  } while( true );
}

Assistant:

saidx_t
sa_simplesearch(const sauchar_t *T, saidx_t Tsize,
                const saidx_t *SA, saidx_t SAsize,
                saint_t c, saidx_t *idx) {
  saidx_t size, lsize, rsize, half;
  saidx_t i, j, k, p;
  saint_t r;

  if(idx != NULL) { *idx = -1; }
  if((T == NULL) || (SA == NULL) || (Tsize < 0) || (SAsize < 0)) { return -1; }
  if((Tsize == 0) || (SAsize == 0)) { return 0; }

  for(i = j = k = 0, size = SAsize, half = size >> 1;
      0 < size;
      size = half, half >>= 1) {
    p = SA[i + half];
    r = (p < Tsize) ? T[p] - c : -1;
    if(r < 0) {
      i += half + 1;
      half -= (size & 1) ^ 1;
    } else if(r == 0) {
      lsize = half, j = i, rsize = size - half - 1, k = i + half + 1;

      /* left part */
      for(half = lsize >> 1;
          0 < lsize;
          lsize = half, half >>= 1) {
        p = SA[j + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r < 0) {
          j += half + 1;
          half -= (lsize & 1) ^ 1;
        }
      }

      /* right part */
      for(half = rsize >> 1;
          0 < rsize;
          rsize = half, half >>= 1) {
        p = SA[k + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r <= 0) {
          k += half + 1;
          half -= (rsize & 1) ^ 1;
        }
      }

      break;
    }
  }

  if(idx != NULL) { *idx = (0 < (k - j)) ? j : i; }
  return k - j;
}